

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O1

void walk_recursive(char *current_dir_string,GDir *current_dir,GTree *current_tree,
                   gboolean follow_symlinks,GSList **errors)

{
  int iVar1;
  long lVar2;
  char *raw;
  GDir *current_dir_00;
  GSList *pGVar3;
  filename_representations *pfVar4;
  GTree *current_tree_00;
  GError *err;
  long local_40;
  filename_representations *local_38;
  
  while (lVar2 = g_dir_read_name(current_dir), lVar2 != 0) {
    raw = (char *)g_build_filename(current_dir_string,lVar2,0);
    iVar1 = g_file_test(raw,4);
    if (iVar1 == 0) {
      iVar1 = g_file_test(raw,1);
      if (iVar1 != 0) {
        pfVar4 = filename_representations_new(raw,2);
        g_tree_insert(current_tree,pfVar4,0);
      }
    }
    else {
      local_40 = 0;
      if ((follow_symlinks != 0) || (iVar1 = g_file_test(raw,2), iVar1 == 0)) {
        current_dir_00 = (GDir *)g_dir_open(raw,0,&local_40);
        if (local_40 == 0) {
          local_38 = filename_representations_new(raw,1);
          current_tree_00 =
               (GTree *)g_tree_new_full(compare_filenames,0,filename_representations_free,
                                        filetree_destroy);
          g_tree_insert(current_tree,local_38,current_tree_00);
          walk_recursive(raw,current_dir_00,current_tree_00,follow_symlinks,errors);
          g_dir_close(current_dir_00);
        }
        else {
          pGVar3 = (GSList *)g_slist_prepend(*errors);
          *errors = pGVar3;
        }
      }
    }
    g_free(raw);
  }
  return;
}

Assistant:

static void walk_recursive(const char *current_dir_string,
                           GDir *current_dir,
                           GTree *current_tree,
                           gboolean follow_symlinks,
                           GSList **errors)
{
    const gchar *basename;
    gchar *filename;

    while ((basename = g_dir_read_name(current_dir))) {
        filename = g_build_filename(current_dir_string, basename, NULL);
        if (g_file_test(filename, G_FILE_TEST_IS_DIR)) {
            struct filename_representations *fr = NULL;
            GError *err = NULL;
            GTree *sub_dir_tree = NULL;
            GDir *sub_dir;

            if (!follow_symlinks
                && g_file_test(filename, G_FILE_TEST_IS_SYMLINK)) {
                goto next;
            }

            sub_dir = g_dir_open(filename, 0, &err);
            if (err) {
                *errors = g_slist_prepend(*errors, err);
                goto next;
            }
            fr = filename_representations_new(filename, FILETREE_DIR);
            sub_dir_tree = g_tree_new_full(compare_filenames, NULL,
                                           filename_representations_free,
                                           filetree_destroy);
            g_tree_insert(current_tree, fr, sub_dir_tree);
            walk_recursive(filename, sub_dir, sub_dir_tree,
                           follow_symlinks, errors);
            g_dir_close(sub_dir);
        } else if (g_file_test(filename, G_FILE_TEST_IS_REGULAR)) {
            struct filename_representations *fr;
            fr = filename_representations_new(filename, FILETREE_FILE);
            g_tree_insert(current_tree, fr, NULL);
        }
      next:
        g_free(filename);
    }
}